

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

color_quad_i16 __thiscall crnlib::etc1_block::unpack_delta3(etc1_block *this,uint16 packed_delta3)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  
  uVar1 = packed_delta3 >> 6 & 7;
  uVar3 = packed_delta3 >> 3 & 7;
  uVar5 = 0;
  if (3 < uVar1) {
    uVar5 = 0xfff8;
  }
  uVar2 = 0;
  if (3 < uVar3) {
    uVar2 = 0xfff8;
  }
  uVar4 = 0;
  if (3 < (packed_delta3 & 7)) {
    uVar4 = 0xfff8;
  }
  *(ushort *)&this->field_0 = uVar5 | uVar1;
  *(ushort *)((long)&this->field_0 + 2) = uVar2 | uVar3;
  *(ushort *)((long)&this->field_0 + 4) = uVar4 | packed_delta3 & 7;
  *(undefined2 *)((long)&this->field_0 + 6) = 0;
  return (color_quad_i16)(anon_union_8_3_dd316fa8_for_color_quad<short,_int>_3)this;
}

Assistant:

color_quad_i16 etc1_block::unpack_delta3(uint16 packed_delta3) {
  int r = (packed_delta3 >> 6) & 7;
  int g = (packed_delta3 >> 3) & 7;
  int b = packed_delta3 & 7;
  if (r >= 4)
    r -= 8;
  if (g >= 4)
    g -= 8;
  if (b >= 4)
    b -= 8;
  return color_quad_i16(r, g, b, 0);
}